

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FrameBuffer *pFVar5;
  FrameBuffer *this;
  FrameBuffer *this_00;
  FrameBuffer *this_01;
  FrameBuffer *this_02;
  Pesawat *this_03;
  FrameBuffer *this_04;
  FrameBuffer *this_05;
  FrameBuffer *this_06;
  FrameBuffer *this_07;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  double local_70;
  double local_68;
  undefined8 local_60;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  int x;
  FrameBuffer *local_40;
  pthread_t inc_x_thread;
  
  system("clear");
  pFVar5 = (FrameBuffer *)operator_new(0x50);
  SiJagur::SiJagur((SiJagur *)pFVar5);
  Polygon::resizeCenter(0.25);
  targetx = 0x154;
  tembakanx = 0x154;
  boolrubah = 0;
  iVar7 = (int)pFVar5;
  Polygon::move(iVar7,0);
  local_ac = tembakanx;
  x = 0;
  this = (FrameBuffer *)operator_new(0x50);
  Baling::Baling((Baling *)this);
  this_00 = (FrameBuffer *)operator_new(0x50);
  Baling::Baling((Baling *)this_00);
  iVar2 = pthread_create(&inc_x_thread,(pthread_attr_t *)0x0,inc_x,&x);
  if (iVar2 != 0) {
    main_cold_1();
    return 1;
  }
  this_01 = (FrameBuffer *)operator_new(0x50);
  Belakang::Belakang((Belakang *)this_01);
  this_02 = (FrameBuffer *)operator_new(0x50);
  TanahIjo::TanahIjo((TanahIjo *)this_02);
  iVar8 = (int)this_01;
  iVar2 = (int)this_02;
  if (tertembak == 0) {
    local_b4 = 0;
    do {
      this_03 = (Pesawat *)operator_new(0x50);
      Pesawat::Pesawat(this_03);
      p = this_03;
      this = (FrameBuffer *)operator_new(0x50);
      Baling::Baling((Baling *)this);
      this_00 = (FrameBuffer *)operator_new(0x50);
      Baling::Baling((Baling *)this_00);
      Polygon::resizeCenter(0.25);
      Polygon::resizeCenter(0.05);
      Polygon::move((int)p,0x96);
      iVar9 = (int)this;
      Polygon::move(iVar9,200);
      Polygon::resizeCenter(0.05);
      iVar4 = (int)this_00;
      Polygon::move(iVar4,100);
      local_b0 = 1;
      iVar10 = 0;
      do {
        if (boolrubah == 1) {
          Polygon::move(iVar7,tembakanx - local_ac);
          local_ac = tembakanx;
          boolrubah = 0;
        }
        Polygon::print(this_01);
        Polygon::setColor(iVar8,0,0xae,0xef);
        Polygon::print(this_02);
        Polygon::setColor(iVar2,0x36,0xda,0x16);
        if (local_b0 == 3) {
          Polygon::resizeCenter(1.1);
          Polygon::resizeCenter(1.03);
          local_b0 = 1;
          Polygon::move(iVar9,6);
          Polygon::resizeCenter(1.03);
          Polygon::move(iVar4,-6);
          iVar10 = iVar10 + 1;
        }
        Polygon::rotateCenter(10.0,0.0,0.0);
        Polygon::rotateCenter(10.0,0.0,0.0);
        Polygon::print((FrameBuffer *)p);
        Polygon::setColor((int)p,0xfc,0xde,0x8a);
        Polygon::print(this);
        Polygon::setColor(iVar9,0,0,0);
        Polygon::print(this_00);
        Polygon::setColor(iVar4,0,0,0);
        if (booltembak == 1) {
          iVar11 = tembakanx + -0x14;
          do {
            iVar3 = targetx - tembakanx;
            Color::Color((Color *)&local_48,-0x42,'\x1a','\x1f','\0');
            line::line((line *)&local_70,iVar11 + 0x23,600,0,iVar11 + iVar3 + 1,0,0,local_48);
            line::print((FrameBuffer *)&local_70);
            iVar11 = iVar11 + 1;
          } while (iVar11 < tembakanx + 0x12);
          if (tembakanx + -10 < tembakanx + 10) {
            iVar11 = tembakanx + -0xb;
            do {
              iVar3 = targetx - tembakanx;
              Color::Color((Color *)&local_4c,-0x15,-0x29,'\0','\0');
              line::line((line *)&local_70,iVar11 + 0x23,600,0,iVar11 + iVar3 + 1,0,0,local_4c);
              line::print((FrameBuffer *)&local_70);
              iVar11 = iVar11 + 1;
            } while (iVar11 < tembakanx + 9);
          }
          local_b4 = local_b4 + 1;
          Polygon::print(pFVar5);
          Polygon::setColor(iVar7,0xc0,0xc0,0xc0);
          if (local_b4 == 6) {
            booltembak = 0;
            local_b4 = 0;
            if (tertembak == 1) break;
          }
        }
        else {
          iVar11 = tembakanx + -4;
          do {
            iVar3 = iVar11 + (targetx - tembakanx) + 1;
            Color::Color((Color *)&local_50,-0x53,'\x1a','\x1f','\0');
            line::line((line *)&local_70,iVar3,0x46,0,iVar3,0x4d,0,local_50);
            line::print((FrameBuffer *)&local_70);
            iVar11 = iVar11 + 1;
          } while (iVar11 < tembakanx + 2);
        }
        Polygon::print(pFVar5);
        Polygon::setColor(iVar7,0xc0,0xc0,0xc0);
        usleep(50000);
        local_b0 = local_b0 + 1;
        FrameBuffer::print();
      } while (iVar10 < 10);
      FrameBuffer::print();
    } while (tertembak == 0);
  }
  this_04 = (FrameBuffer *)operator_new(0x50);
  Boom::Boom((Boom *)this_04);
  this_05 = (FrameBuffer *)operator_new(0x50);
  Boom::Boom((Boom *)this_05);
  this_06 = (FrameBuffer *)operator_new(0x50);
  Parachute::Parachute((Parachute *)this_06);
  this_07 = (FrameBuffer *)operator_new(0x50);
  Orang::Orang((Orang *)this_07);
  pFVar5 = (FrameBuffer *)operator_new(0x50);
  Roda::Roda((Roda *)pFVar5);
  Polygon::resizeCenter(0.3);
  Polygon::move((int)this_04,0x96);
  Polygon::resizeCenter(0.1);
  iVar7 = (int)this_06;
  Polygon::move(iVar7,-0x50);
  Polygon::resizeCenter(0.1);
  Polygon::move((int)pFVar5,-100);
  Polygon::resizeCenter(0.2);
  iVar9 = (int)this_07;
  Polygon::move(iVar9,-0x50);
  Polygon::resizeCenter(0.25);
  Polygon::move((int)this_05,0x96);
  Polygon::print(this_01);
  Polygon::setColor(iVar8,0,0xae,0xef);
  Polygon::print(this_02);
  Polygon::setColor(iVar2,0x36,0xda,0x16);
  Polygon::print(this_04);
  Polygon::setColor((int)this_04,0xbe,0x1a,0x1f);
  Polygon::print(this_05);
  Polygon::setColor((int)this_05,0xeb,0xd7,0);
  FrameBuffer::print();
  usleep(1000000);
  local_b0 = Polygon::MaxY();
  local_b0 = 0x20d - local_b0;
  local_ac = 1;
  local_b8 = 70.0;
  local_b4 = 0;
  cVar6 = '\x01';
  local_40 = pFVar5;
  do {
    Polygon::print(this_01);
    Polygon::setColor(iVar8,0,0xae,0xef);
    Polygon::print(this_02);
    Polygon::setColor(iVar2,0x36,0xda,0x16);
    Polygon::print(this_06);
    Polygon::setColor(iVar7,0xff,0xff,0xff);
    Polygon::print(this_07);
    Polygon::setColor(iVar9,0xdc,0x14,0x3c);
    iVar4 = Polygon::MaxY();
    if ((cVar6 == '\x01') && (iVar4 < 0x23f)) {
      Polygon::move((int)pFVar5,(uint)(299 < local_b0) * 3 + -3);
LAB_00102f1f:
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (cVar6 == '\x01') {
        iVar4 = Polygon::MaxY();
        if (iVar4 < 0x23f) goto LAB_00102f1f;
        local_b0 = (int)((double)local_b0 / 1.5);
        if (local_b0 < 10) {
          FrameBuffer::clear();
          return 0;
        }
      }
    }
    iVar4 = Polygon::MaxY();
    if ((bVar1) && (0x23f - local_b0 < iVar4)) {
      Polygon::move((int)pFVar5,-3);
      cVar6 = '\x02';
    }
    else {
      cVar6 = '\x01';
      if (bVar1) {
        iVar4 = Polygon::MaxY();
        cVar6 = (0x23f - local_b0 < iVar4) + '\x01';
      }
    }
    iVar4 = Polygon::MaxY();
    if (iVar4 < 0x24e) {
      Polygon::move(iVar9,0);
      Polygon::move(iVar7,0);
      if (local_b4 == -5) {
        local_ac = -1;
      }
      else if (local_b4 == 5) {
        local_ac = 1;
      }
      if (local_ac == 1) {
        iVar4 = Polygon::MinX();
        iVar10 = Polygon::MaxX();
        iVar11 = Polygon::MinY();
        local_68 = (double)iVar11;
        local_60 = 0;
        local_70 = (double)((iVar10 + iVar4) / 2);
        Polygon::rotate(4.0,(Point *)this_07,0.0,0.0);
        iVar4 = Polygon::MinX();
        iVar10 = Polygon::MaxX();
        iVar11 = Polygon::MinY();
        pFVar5 = local_40;
        local_68 = (double)iVar11;
        local_60 = 0;
        local_70 = (double)((iVar10 + iVar4) / 2);
        Polygon::rotate(4.0,(Point *)this_06,0.0,0.0);
        local_b4 = local_b4 + -1;
        local_ac = 1;
      }
      else if (local_ac == -1) {
        iVar4 = Polygon::MinX();
        iVar10 = Polygon::MaxX();
        iVar11 = Polygon::MinY();
        local_68 = (double)iVar11;
        local_60 = 0;
        local_70 = (double)((iVar10 + iVar4) / 2);
        Polygon::rotate(-4.0,(Point *)this_07,0.0,0.0);
        iVar4 = Polygon::MinX();
        iVar10 = Polygon::MaxX();
        iVar11 = Polygon::MinY();
        pFVar5 = local_40;
        local_68 = (double)iVar11;
        local_60 = 0;
        local_70 = (double)((iVar10 + iVar4) / 2);
        Polygon::rotate(-4.0,(Point *)this_06,0.0,0.0);
        local_b4 = local_b4 + 1;
        local_ac = -1;
      }
    }
    iVar4 = Polygon::MaxY();
    if ((iVar4 < 0x20d) && (0.0 < local_b8)) {
      Polygon::move((int)this_00,0);
      Polygon::rotateCenter((double)local_b8,0.0,0.0);
      Polygon::move((int)this,0);
      Polygon::rotateCenter((double)local_b8,0.0,0.0);
      local_b8 = local_b8 + -2.0;
    }
    Polygon::print(pFVar5);
    Polygon::setColor((int)pFVar5,0,0,0);
    Polygon::print(this);
    Polygon::setColor((int)this,0,0,0);
    Polygon::print(this_00);
    Polygon::setColor((int)this_00,0,0,0);
    FrameBuffer::print();
    usleep(50000);
  } while( true );
}

Assistant:

int main() {
  system("clear");
  SiJagur* meriam = new SiJagur();
  meriam->resizeCenter(0.25);
  targetx = 340;
  tembakanx = 340;
  boolrubah=0;
  meriam->move(0,215);
  int waktutembak=0;
  int x=0;
  int temp = tembakanx;
  Baling* p2 = new Baling();
  Baling* p3 = new Baling();
  pthread_t inc_x_thread;
  if(pthread_create(&inc_x_thread, NULL, inc_x, &x)) {
      fprintf(stderr, "Error creating thread\n");
      return 1;
  }
  Belakang* bel = new Belakang();
  TanahIjo* ijo = new TanahIjo();
  while(tertembak==0){
    p = new Pesawat();
    p2 = new Baling();
    p3 = new Baling();
    float alpa = 1;
    p->resizeCenter(0.25);
    p2->resizeCenter(0.05);
    p->move(150,-200);
    p2->move(200,-215);
    p3->resizeCenter(0.05);
    p3->move(100,-215);
    int hitung = 1;
    int selesai=0;
    while(selesai<10){
      if(boolrubah==1){
        meriam->move(tembakanx-temp,0);
        temp=tembakanx;
        boolrubah=0;
      }
      bel->print(fb);bel->setColor(0,174,239,alpa);
      ijo->print(fb);ijo->setColor(54,218,22,alpa);
      if(hitung == 3){
        p->resizeCenter(1.1);
        p2->resizeCenter(1.03);
        //p2->resizeCenter(1.15);
        p2->move(6,1);    
        p3->resizeCenter(1.03);
        //p3->resizeCenter(1.15);
        p3->move(-6,1);
        hitung=1;
        selesai++;
      }
      p2->rotateCenter(10);
      p3->rotateCenter(10);
      p->print(fb);p->setColor(252,222,138,alpa);
      p2->print(fb);p2->setColor(0,0,0,alpa);
      p3->print(fb);p3->setColor(0,0,0,alpa);
      if(booltembak==1){
        for(int j=tembakanx-19;j<tembakanx+19;j++)
          line(j+34,600,0,targetx+j-tembakanx,0,0,Color(190,26,31)).print(fb); 
         for(int j=tembakanx-10;j<tembakanx+10;j++)
          line(j+34,600,0,targetx+j-tembakanx,0,0,Color(235,215,0)).print(fb); 
        waktutembak++;
        meriam->print(fb);meriam->setColor(192,192,192,alpa);
        if(waktutembak==6){
          booltembak=0;
          waktutembak=0;
          if(tertembak==1)
            break;
        }
      }
      else{
        for(int j=tembakanx-3;j<tembakanx+3;j++)
          line(targetx+j-tembakanx,70,0,targetx+j-tembakanx,77,0,Color(173,26,31)).print(fb); 
       }
      meriam->print(fb);meriam->setColor(192,192,192,alpa);
      usleep(50000);
      hitung++;
      alpa +=5;
      fb.print();
    }
    fb.print();
  }
  Boom* boom = new Boom();
  Boom* boom2 = new Boom();
  Parachute* parasut = new Parachute();
  Orang* orang = new Orang();
  Roda* ban = new Roda();
  boom->resizeCenter(0.3);
  boom->move(150,-140);
  parasut->resizeCenter(0.1);
  parasut->move(-80,-200);
  ban->resizeCenter(0.1);
  ban->move(-100,-200);
  orang->resizeCenter(0.2);
  orang->move(-80,-260);
  boom2->resizeCenter(0.25);
  boom2->move(150,-140);
  bel->print(fb);bel->setColor(0,174,239,0);
  ijo->print(fb);ijo->setColor(54,218,22,0);
  boom->print(fb);boom->setColor(190,26,31,0);
  boom2->print(fb);boom2->setColor(235,215,0,0);
  fb.print();
  usleep(1000000);
  int g=10;
  float mutar=70;
  int buatputar=0;
  int kount=1;
  
  int tinggi=525-ban->MaxY();
  int tahap=1;
  while(true){
    bel->print(fb);bel->setColor(0,174,239,0);
    ijo->print(fb);ijo->setColor(54,218,22,0);
    parasut->print(fb);parasut->setColor(255,255,255,0);
    orang->print(fb);orang->setColor(220,20,60,0);
    if(ban->MaxY()<575&&tahap==1){
      if(tinggi<300)
      ban->move(-3,g/10);
      else
      ban->move(0,g/10);
      g+=10;
    }
    else if(tahap==1&&ban->MaxY()>=575){
      tahap++;
      tinggi=tinggi/1.5;
      if(tinggi<10){
        tahap=0;
        break;
      }
    }
    if(ban->MaxY()>575-tinggi&&tahap==2){
      ban->move(-3,-g/10);
      g-=10;
    }
    else if(tahap==2&&ban->MaxY()<=575-tinggi){
      tahap--;
    }
    if(orang->MaxY()<590){
      orang->move(0,5);
      parasut->move(0,5);
      if(buatputar==-5){
        kount=-1;
      }
      else if(buatputar==5){
        kount=1;
      }
      if(kount==-1){
         orang->rotate(-4,Point<double>((parasut->MinX()+parasut->MaxX())/2,parasut->MinY()));
         parasut->rotate(-4, Point<double>((parasut->MinX()+parasut->MaxX())/2,parasut->MinY()));
         buatputar++;
      }
      else if(kount==1){
        orang->rotate(4,Point<double>((parasut->MinX()+parasut->MaxX())/2,parasut->MinY()));
        parasut->rotate(4,Point<double>((parasut->MinX()+parasut->MaxX())/2,parasut->MinY()));
        buatputar--;
      }
    }
    if(p3->MaxY()<525 && mutar>0){
      p3->move(0,g/10);
      p3->rotateCenter(mutar);
      p2->move(0,g/10);
      p2->rotateCenter(mutar);
      mutar-=2;
    }
    ban->print(fb);ban->setColor(0,0,0,0);
    p2->print(fb);p2->setColor(0,0,0,0);
    p3->print(fb);p3->setColor(0,0,0,0);
    fb.print();
    usleep(50000);
  }
  fb.clear();
  return 0;
}